

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O1

HTS_Boolean HTS_get_token_from_fp_with_separator(HTS_File *fp,char *buff,char separator)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (fp == (HTS_File *)0x0) {
    return '\0';
  }
  iVar2 = HTS_feof(fp);
  if (iVar2 == 0) {
    iVar2 = HTS_fgetc(fp);
    do {
      if ((char)iVar2 != separator) {
        lVar1 = 0;
        goto LAB_00177388;
      }
      iVar2 = HTS_feof(fp);
    } while ((iVar2 == 0) && (iVar2 = HTS_fgetc(fp), (char)iVar2 != -1));
  }
  return '\0';
  while( true ) {
    iVar2 = HTS_fgetc(fp);
    lVar1 = lVar3 + 1;
    if ((char)iVar2 == -1) break;
LAB_00177388:
    lVar3 = lVar1;
    if ((char)iVar2 == separator) goto LAB_001773b3;
    buff[lVar3] = (char)iVar2;
    iVar2 = HTS_feof(fp);
    if (iVar2 != 0) break;
  }
  lVar3 = lVar3 + 1;
LAB_001773b3:
  buff[lVar3] = '\0';
  return '\x01';
}

Assistant:

HTS_Boolean HTS_get_token_from_fp_with_separator(HTS_File * fp, char *buff, char separator)
{
   char c;
   size_t i;

   if (fp == NULL || HTS_feof(fp))
      return FALSE;
   c = HTS_fgetc(fp);
   while (c == separator) {
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      if (c == EOF)
         return FALSE;
   }

   for (i = 0; c != separator;) {
      buff[i++] = c;
      if (HTS_feof(fp))
         break;
      c = HTS_fgetc(fp);
      if (c == EOF)
         break;
   }

   buff[i] = '\0';
   return TRUE;
}